

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_grid.c
# Opt level: O0

REF_STATUS
ref_grid_node_list_around
          (REF_GRID ref_grid,REF_INT node,REF_INT max_node,REF_INT *nnode,REF_INT *node_list)

{
  bool bVar1;
  REF_INT local_64;
  REF_INT local_60;
  int local_5c;
  REF_STATUS ref_private_macro_code_rss;
  REF_BOOL already_have_it;
  REF_CELL ref_cell;
  int local_40;
  REF_INT group;
  REF_INT haves;
  REF_INT cell_node;
  REF_INT item;
  REF_INT cell;
  REF_INT *node_list_local;
  REF_INT *nnode_local;
  REF_INT max_node_local;
  REF_INT node_local;
  REF_GRID ref_grid_local;
  
  *nnode = 0;
  ref_cell._4_4_ = 3;
  _ref_private_macro_code_rss = ref_grid->cell[3];
  do {
    if (0xf < ref_cell._4_4_) {
      return 0;
    }
    if ((node < 0) || (_ref_private_macro_code_rss->ref_adj->nnode <= node)) {
      local_5c = -1;
    }
    else {
      local_5c = _ref_private_macro_code_rss->ref_adj->first[node];
    }
    haves = local_5c;
    if (local_5c == -1) {
      local_60 = -1;
    }
    else {
      local_60 = _ref_private_macro_code_rss->ref_adj->item[local_5c].ref;
    }
    cell_node = local_60;
    while (haves != -1) {
      for (group = 0; group < _ref_private_macro_code_rss->node_per; group = group + 1) {
        if (node != _ref_private_macro_code_rss->c2n
                    [group + _ref_private_macro_code_rss->size_per * cell_node]) {
          bVar1 = false;
          for (local_40 = 0; local_40 < *nnode; local_40 = local_40 + 1) {
            if (node_list[local_40] ==
                _ref_private_macro_code_rss->c2n
                [group + _ref_private_macro_code_rss->size_per * cell_node]) {
              bVar1 = true;
              break;
            }
          }
          if (!bVar1) {
            if (max_node <= *nnode) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c"
                     ,0x35f,"ref_grid_node_list_around",7,"max_node too small");
              return 7;
            }
            node_list[*nnode] =
                 _ref_private_macro_code_rss->c2n
                 [group + _ref_private_macro_code_rss->size_per * cell_node];
            *nnode = *nnode + 1;
          }
        }
      }
      haves = _ref_private_macro_code_rss->ref_adj->item[haves].next;
      if (haves == -1) {
        local_64 = -1;
      }
      else {
        local_64 = _ref_private_macro_code_rss->ref_adj->item[haves].ref;
      }
      cell_node = local_64;
    }
    ref_cell._4_4_ = ref_cell._4_4_ + 1;
    _ref_private_macro_code_rss = ref_grid->cell[ref_cell._4_4_];
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_grid_node_list_around(REF_GRID ref_grid, REF_INT node,
                                             REF_INT max_node, REF_INT *nnode,
                                             REF_INT *node_list) {
  REF_INT cell, item, cell_node, haves, group;
  REF_CELL ref_cell;
  REF_BOOL already_have_it;

  *nnode = 0;
  each_ref_grid_2d_3d_ref_cell(ref_grid, group, ref_cell) {
    each_ref_cell_having_node(ref_cell, node, item, cell) {
      for (cell_node = 0; cell_node < ref_cell_node_per(ref_cell);
           cell_node++) {
        if (node == ref_cell_c2n(ref_cell, cell_node, cell)) continue;
        already_have_it = REF_FALSE;
        for (haves = 0; haves < *nnode; haves++)
          if (node_list[haves] == ref_cell_c2n(ref_cell, cell_node, cell)) {
            already_have_it = REF_TRUE;
            break;
          }
        if (!already_have_it) {
          if (*nnode >= max_node) {
            RSS(REF_INCREASE_LIMIT, "max_node too small");
          }
          node_list[*nnode] = ref_cell_c2n(ref_cell, cell_node, cell);
          (*nnode)++;
        }
      }
    }
  }

  return REF_SUCCESS;
}